

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O0

void __thiscall VcprojGenerator::initPreLinkEventTools(VcprojGenerator *this)

{
  QLatin1StringView sep;
  bool bVar1;
  byte bVar2;
  ProKey *in_RDI;
  long in_FS_OFFSET;
  VCConfiguration *conf;
  QStringList cmdline;
  QMakeProject *this_00;
  undefined7 in_stack_ffffffffffffff28;
  QLatin1String *this_01;
  qsizetype in_stack_ffffffffffffff40;
  QString *in_stack_ffffffffffffff48;
  undefined1 local_98 [48];
  undefined1 local_68 [24];
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (QLatin1String *)&in_RDI[0xc].super_ProString.m_hash;
  this_00 = *(QMakeProject **)&in_RDI[4].super_ProString.m_offset;
  ProKey::ProKey((ProKey *)this_00,(char *)in_RDI);
  QMakeProject::values(this_00,in_RDI);
  bVar1 = QList<ProString>::isEmpty((QList<ProString> *)0x2987e9);
  bVar2 = bVar1 ^ 0xff;
  ProKey::~ProKey((ProKey *)0x2987fc);
  if ((bVar2 & 1) != 0) {
    local_50 = 0xaaaaaaaaaaaaaaaa;
    local_48 = 0xaaaaaaaaaaaaaaaa;
    local_40 = 0xaaaaaaaaaaaaaaaa;
    ProKey::ProKey((ProKey *)this_00,(char *)in_RDI);
    (**(code **)&(in_RDI->super_ProString).m_string.d.d[0xb].super_QArrayData)
              (local_68,in_RDI,local_98);
    VCToolBase::fixCommandLine(in_stack_ffffffffffffff48);
    QString::~QString((QString *)0x298883);
    ProKey::~ProKey((ProKey *)0x29888d);
    QList<QString>::operator=((QList<QString> *)this_00,(QList<QString> *)in_RDI);
    QLatin1String::QLatin1String(this_01,(char *)CONCAT17(bVar2,in_stack_ffffffffffffff28));
    sep.m_data = (char *)in_stack_ffffffffffffff48;
    sep.m_size = in_stack_ffffffffffffff40;
    QListSpecialMethods<QString>::join((QListSpecialMethods<QString> *)this_00,sep);
    QString::operator=((QString *)this_00,(QString *)in_RDI);
    QString::~QString((QString *)0x2988fb);
    *(undefined4 *)&this_01[0xd1].m_size = 0;
    QList<QString>::~QList((QList<QString> *)0x298917);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void VcprojGenerator::initPreLinkEventTools()
{
    VCConfiguration &conf = vcProject.Configuration;
    if(!project->values("QMAKE_PRE_LINK").isEmpty()) {
        QStringList cmdline = VCToolBase::fixCommandLine(var("QMAKE_PRE_LINK"));
        conf.preLink.CommandLine = cmdline;
        conf.preLink.Description = cmdline.join(QLatin1String("\r\n"));
        conf.preLink.ExcludedFromBuild = _False;
    }
}